

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::LRNParameter::InternalSwap(LRNParameter *this,LRNParameter *other)

{
  float fVar1;
  int iVar2;
  uint32 uVar3;
  void *pvVar4;
  UnknownFieldSet *other_00;
  
  iVar2 = this->norm_region_;
  this->norm_region_ = other->norm_region_;
  other->norm_region_ = iVar2;
  iVar2 = this->engine_;
  this->engine_ = other->engine_;
  other->engine_ = iVar2;
  uVar3 = this->local_size_;
  this->local_size_ = other->local_size_;
  other->local_size_ = uVar3;
  fVar1 = this->alpha_;
  this->alpha_ = other->alpha_;
  other->alpha_ = fVar1;
  fVar1 = this->beta_;
  this->beta_ = other->beta_;
  other->beta_ = fVar1;
  fVar1 = this->k_;
  this->k_ = other->k_;
  other->k_ = fVar1;
  uVar3 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar3;
  pvVar4 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar4 & 1) == 0) goto LAB_004a3bbd;
LAB_004a3bb0:
    other_00 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar4 & 1) != 0) goto LAB_004a3bb0;
    other_00 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  google::protobuf::internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00)
  ;
LAB_004a3bbd:
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void LRNParameter::InternalSwap(LRNParameter* other) {
  std::swap(norm_region_, other->norm_region_);
  std::swap(engine_, other->engine_);
  std::swap(local_size_, other->local_size_);
  std::swap(alpha_, other->alpha_);
  std::swap(beta_, other->beta_);
  std::swap(k_, other->k_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}